

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colors.cpp
# Opt level: O1

void Colors::outputColorCode(ostream *stream,char *colorCode)

{
  size_t sVar1;
  
  if (outputColorCode(std::ostream&,char_const*)::has_color == '\0') {
    outputColorCode();
  }
  if ((outputColorCode::has_color == true) && (::(anonymous_namespace)::colors_enabled == '\x01')) {
    if (colorCode != (char *)0x0) {
      sVar1 = strlen(colorCode);
      std::__ostream_insert<char,std::char_traits<char>>(stream,colorCode,sVar1);
      return;
    }
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    return;
  }
  return;
}

Assistant:

void Colors::outputColorCode(std::ostream& stream, const char* colorCode) {
  const static bool has_color = []() {
    return (getenv("COLORS") && getenv("COLORS")[0] == '1') || // forced
           (isatty(STDOUT_FILENO) &&
            (!getenv("COLORS") || getenv("COLORS")[0] != '0')); // implicit
  }();
  if (has_color && colors_enabled) {
    stream << colorCode;
  }
}